

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *s;
  bool bVar1;
  size_type sVar2;
  bool log_info;
  bool bVar3;
  int iVar4;
  TemplateRecord *pTVar5;
  string *psVar6;
  size_type sVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  string *psVar12;
  pointer ppTVar13;
  ulong uVar14;
  key_type *__x;
  long lVar15;
  vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> template_records;
  TemplateRecord *template_rec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_seen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string cleantext;
  string all_header_entries;
  int option_index;
  string FLAG_outputfile;
  string output;
  string progname;
  string FLAG_header_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  template_filenames;
  string FLAG_outputfile_suffix;
  string FLAG_template_dir;
  
  std::__cxx11::string::string
            ((string *)&FLAG_template_dir,(char *)&ctemplate::kCWD,(allocator *)&lines_seen);
  std::__cxx11::string::string
            ((string *)&FLAG_header_dir,(char *)&ctemplate::kCWD,(allocator *)&lines_seen);
  ctemplate::NormalizeDirectory((string *)&FLAG_header_dir);
  std::__cxx11::string::string
            ((string *)&FLAG_outputfile_suffix,".varnames.h",(allocator *)&lines_seen);
  std::__cxx11::string::string((string *)&FLAG_outputfile,"",(allocator *)&lines_seen);
  bVar3 = false;
  bVar1 = true;
  log_info = true;
  iVar4 = 0;
LAB_00104548:
  if (iVar4 != -1) {
    iVar4 = getopt_long(argc,argv,"t:o:s:f:ndqhV",main::longopts,&option_index);
    if (iVar4 - 100U < 0x11) {
      psVar12 = &FLAG_header_dir;
      switch(iVar4) {
      case 100:
        bVar3 = true;
        goto LAB_00104548;
      default:
        goto switchD_00104582_caseD_65;
      case 0x66:
        psVar12 = &FLAG_outputfile;
        break;
      case 0x68:
        Usage(*argv,_stderr);
        goto LAB_0010484b;
      case 0x6e:
        bVar1 = false;
        goto LAB_00104548;
      case 0x6f:
        break;
      case 0x71:
        log_info = false;
        goto LAB_00104548;
      case 0x73:
        psVar12 = &FLAG_outputfile_suffix;
        break;
      case 0x74:
        psVar12 = &FLAG_template_dir;
      }
      std::__cxx11::string::assign((char *)psVar12);
      goto LAB_00104548;
    }
    if (iVar4 != -1) {
      if (iVar4 == 0x56) {
        fwrite("make_tpl_varnames_h  (part of ctemplate 2.3.0)\n\nCopyright 1998 Google Inc.\n\nThis is BSD licensed software; see the source for copying conditions\nand license information.\nThere is NO warranty; not even for MERCHANTABILITY or FITNESS FOR A\nPARTICULAR PURPOSE.\n"
               ,0x102,1,_stdout);
LAB_0010484b:
        uVar8 = 0;
      }
      else {
switchD_00104582_caseD_65:
        Usage(*argv,_stderr);
        uVar8 = 1;
      }
LAB_00104c3d:
      std::__cxx11::string::~string((string *)&FLAG_outputfile);
      std::__cxx11::string::~string((string *)&FLAG_outputfile_suffix);
      std::__cxx11::string::~string((string *)&FLAG_header_dir);
      std::__cxx11::string::~string((string *)&FLAG_template_dir);
      return uVar8;
    }
    goto LAB_00104548;
  }
  if (argc <= _optind) {
    LogPrintf(3,log_info,"Must specify at least one template file on the command line.");
  }
  ctemplate::Template::SetTemplateRootDirectory(&FLAG_template_dir);
  template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar15 = (long)_optind; lVar15 < argc; lVar15 = lVar15 + 1) {
    pTVar5 = (TemplateRecord *)operator_new(0x48);
    std::__cxx11::string::string((string *)&lines_seen,argv[lVar15],(allocator *)&progname);
    TemplateRecord::TemplateRecord(pTVar5,(string *)&lines_seen);
    std::__cxx11::string::~string((string *)&lines_seen);
    template_rec = pTVar5;
    std::vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::push_back
              (&template_records,&template_rec);
  }
  uVar11 = 0;
  for (ppTVar13 = template_records.
                  super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppTVar13 !=
      template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
    s = ((*ppTVar13)->name)._M_dataplus._M_p;
    LogPrintf(0,log_info,"\n------ Checking %s ------",s);
    ctemplate::TemplateString::TemplateString((TemplateString *)&lines_seen,s);
    psVar6 = (string *)ctemplate::Template::GetTemplate((TemplateString *)&lines_seen,DO_NOT_STRIP);
    if (psVar6 == (string *)0x0) {
      LogPrintf(2,log_info,"Could not load file: %s",s);
      uVar11 = uVar11 + 1;
      (*ppTVar13)->error = true;
    }
    else {
      LogPrintf(0,log_info,"No syntax errors detected in %s",s);
      if (bVar3) {
        ctemplate::Template::template_file();
        ctemplate::Template::Dump((char *)psVar6);
      }
      if (bVar1) {
        ctemplate::Template::WriteHeaderEntries(psVar6);
      }
    }
  }
  ppTVar13 = template_records.
             super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (bVar1) {
    std::__cxx11::string::string((string *)&progname,*argv,(allocator *)&lines_seen);
    if (FLAG_outputfile._M_string_length == 0) {
      for (ppTVar13 = template_records.
                      super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppTVar13 !=
          template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
        if ((*ppTVar13)->error == false) {
          ctemplate::Basename((string *)&lines_seen);
          std::operator+(&all_header_entries,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &lines_seen,&FLAG_outputfile_suffix);
          ctemplate::PathJoin((string *)&template_rec,(string *)&FLAG_header_dir);
          std::__cxx11::string::~string((string *)&all_header_entries);
          cleantext._M_dataplus._M_p = (pointer)0x0;
          cleantext._M_string_length = 0;
          cleantext.field_2._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cleantext,&(*ppTVar13)->name);
          Boilerplate(&all_header_entries,&progname,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cleantext);
          WrapWithGuard(&output,(string *)&template_rec,&(*ppTVar13)->header_entries);
          std::__cxx11::string::append((string *)&all_header_entries);
          std::__cxx11::string::~string((string *)&output);
          bVar3 = WriteToDisk(log_info,(string *)&template_rec,&all_header_entries);
          uVar11 = uVar11 + !bVar3;
          std::__cxx11::string::~string((string *)&all_header_entries);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cleantext);
          std::__cxx11::string::~string((string *)&template_rec);
          std::__cxx11::string::~string((string *)&lines_seen);
        }
      }
    }
    else if (uVar11 == 0) {
      template_filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_header_entries._M_dataplus._M_p = (pointer)&all_header_entries.field_2;
      all_header_entries._M_string_length = 0;
      template_filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      template_filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      all_header_entries.field_2._M_local_buf[0] = '\0';
      for (ppTVar13 = template_records.
                      super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppTVar13 !=
          template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
        std::__cxx11::string::append((string *)&all_header_entries);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&template_filenames,&(*ppTVar13)->name);
      }
      Boilerplate(&output,&progname,&template_filenames);
      sVar2 = all_header_entries._M_string_length;
      cleantext._M_dataplus._M_p = (pointer)&cleantext.field_2;
      cleantext._M_string_length = 0;
      lines_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &lines_seen._M_t._M_impl.super__Rb_tree_header._M_header;
      lines_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      lines_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      lines_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cleantext.field_2._M_allocated_capacity =
           cleantext.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lines_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           lines_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        lVar15 = std::__cxx11::string::find((char)&all_header_entries,10);
        if (lVar15 == -1) {
          std::__cxx11::string::substr((ulong)&template_rec,(ulong)&all_header_entries);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &template_rec);
          std::__cxx11::string::~string((string *)&template_rec);
          break;
        }
        std::__cxx11::string::substr((ulong)&template_rec,(ulong)&all_header_entries);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &template_rec);
        std::__cxx11::string::~string((string *)&template_rec);
      } while (lVar15 + 1U < sVar2);
      uVar9 = (ulong)((long)local_178.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5;
      uVar14 = 0;
      uVar10 = uVar9 & 0xffffffff;
      if ((int)uVar9 < 1) {
        uVar10 = uVar14;
      }
      for (; uVar10 * 0x20 != uVar14; uVar14 = uVar14 + 0x20) {
        __x = (key_type *)
              ((long)&((local_178.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar14);
        if ((LineIsAllWhitespace(std::__cxx11::string_const&)::kWhitespace_abi_cxx11_ == '\0') &&
           (iVar4 = __cxa_guard_acquire(&LineIsAllWhitespace(std::__cxx11::string_const&)::
                                         kWhitespace_abi_cxx11_), iVar4 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     LineIsAllWhitespace(std::__cxx11::string_const&)::kWhitespace_abi_cxx11_,
                     " \f\t\v\r",(allocator *)&template_rec);
          __cxa_atexit(std::__cxx11::string::~string,
                       LineIsAllWhitespace(std::__cxx11::string_const&)::kWhitespace_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&LineIsAllWhitespace(std::__cxx11::string_const&)::
                               kWhitespace_abi_cxx11_);
        }
        lVar15 = std::__cxx11::string::find_first_not_of((string *)__x,0x109368);
        if ((lVar15 == -1) ||
           (sVar7 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&lines_seen,__x), sVar7 == 0)) {
          std::__cxx11::string::append((string *)&cleantext);
          std::__cxx11::string::append((char *)&cleantext);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&lines_seen,__x);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_178);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&lines_seen._M_t);
      WrapWithGuard((string *)&lines_seen,&FLAG_outputfile,&cleantext);
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::~string((string *)&lines_seen);
      bVar3 = WriteToDisk(log_info,&FLAG_outputfile,&output);
      uVar11 = (uint)!bVar3;
      std::__cxx11::string::~string((string *)&cleantext);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&all_header_entries);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&template_filenames);
    }
    std::__cxx11::string::~string((string *)&progname);
    ppTVar13 = template_records.
               super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  for (; ppTVar13 !=
         template_records.super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>.
         _M_impl.super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
    pTVar5 = *ppTVar13;
    if (pTVar5 != (TemplateRecord *)0x0) {
      TemplateRecord::~TemplateRecord(pTVar5);
    }
    operator_delete(pTVar5);
  }
  uVar8 = 0x7f;
  if ((int)uVar11 < 0x7f) {
    uVar8 = uVar11;
  }
  std::_Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>::~_Vector_base
            (&template_records.
              super__Vector_base<TemplateRecord_*,_std::allocator<TemplateRecord_*>_>);
  goto LAB_00104c3d;
}

Assistant:

int main(int argc, char **argv) {
  string FLAG_template_dir(GOOGLE_NAMESPACE::kCWD);   // "./"
  string FLAG_header_dir(GOOGLE_NAMESPACE::kCWD);
  GOOGLE_NAMESPACE::NormalizeDirectory(&FLAG_header_dir);   // adds trailing slash
  string FLAG_outputfile_suffix(".varnames.h");
  string FLAG_outputfile("");
  bool FLAG_header = true;
  bool FLAG_dump_templates = false;
  bool FLAG_log_info = true;

#if defined(HAVE_GETOPT_LONG)
  static struct option longopts[] = {
    {"help", 0, NULL, 'h'},
    {"version", 0, NULL, 'V'},
    {"template_dir", 1, NULL, 't'},
    {"header_dir", 1, NULL, 'o'},
    {"outputfile_suffix", 1, NULL, 's'},
    {"outputfile", 1, NULL, 'f'},
    {"noheader", 0, NULL, 'n'},
    {"dump_templates", 0, NULL, 'd'},
    {"nolog_info", 0, NULL, 'q'},
    {"v", 1, NULL, 'q'},
    {0, 0, 0, 0}
  };
  int option_index;
# define GETOPT(argc, argv)  getopt_long(argc, argv, "t:o:s:f:ndqhV", \
                                         longopts, &option_index)
#elif defined(HAVE_GETOPT_H)
# define GETOPT(argc, argv)  getopt(argc, argv, "t:o:s:f:ndqhV")
#else    // TODO(csilvers): implement something reasonable for windows
# define GETOPT(argc, argv)  -1
  int optind = 1;    // first non-opt argument
  const char* optarg = "";   // not used
#endif

  int r = 0;
  while (r != -1) {   // getopt()/getopt_long() return -1 upon no-more-input
    r = GETOPT(argc, argv);
    switch (r) {
      case 't': FLAG_template_dir.assign(optarg); break;
      case 'o': FLAG_header_dir.assign(optarg); break;
      case 's': FLAG_outputfile_suffix.assign(optarg); break;
      case 'f': FLAG_outputfile.assign(optarg); break;
      case 'n': FLAG_header = false; break;
      case 'd': FLAG_dump_templates = true; break;
      case 'q': FLAG_log_info = false; break;
      case 'V': Version(stdout); return 0; break;
      case 'h': Usage(argv[0], stderr); return 0; break;
      case -1: break;   // means 'no more input'
      default: Usage(argv[0], stderr); return 1; break;
    }
  }

  if (optind >= argc) {
    LogPrintf(LOG_FATAL, FLAG_log_info,
              "Must specify at least one template file on the command line.");
  }

  Template::SetTemplateRootDirectory(FLAG_template_dir);


  // Initialize the TemplateRecord array. It holds one element per
  // template given on the command-line.
  vector<TemplateRecord*> template_records;
  for (int i = optind; i < argc; ++i) {
    TemplateRecord *template_rec = new TemplateRecord(argv[i]);
    template_records.push_back(template_rec);
  }

  // Iterate through each template and (unless -n is given), write
  // its header entries into the headers array.
  int num_errors = 0;
  for (vector<TemplateRecord*>::iterator it = template_records.begin();
       it != template_records.end(); ++it) {
    const char* tplname = (*it)->name.c_str();
    LogPrintf(LOG_INFO, FLAG_log_info, "\n------ Checking %s ------", tplname);

    // The last two arguments in the following call do not matter
    // since they control how the template gets expanded and we never
    // expand the template after loading it here
    Template * tpl = Template::GetTemplate(tplname, GOOGLE_NAMESPACE::DO_NOT_STRIP);

    // The call to GetTemplate (above) loads the template from disk
    // and attempts to parse it. If it cannot find the file or if it
    // detects any template syntax errors, the parsing routines
    // report the error and GetTemplate returns NULL. Syntax errors
    // include such things as mismatched double-curly-bracket pairs,
    // e.g. '{{VAR}', Invalid characters in template variables or
    // section names, e.g.  '{{BAD_VAR?}}' [the question mark is
    // illegal], improperly nested section/end section markers,
    // e.g. a section close marker with no section start marker or a
    // section start of a different name.
    // If that happens, since the parsing errors have already been reported
    // we just continue on to the next one.
    if (!tpl) {
      LogPrintf(LOG_ERROR, FLAG_log_info, "Could not load file: %s", tplname);
      num_errors++;
      (*it)->error = true;
      continue;
    } else {
      LogPrintf(LOG_INFO, FLAG_log_info, "No syntax errors detected in %s",
                tplname);
      if (FLAG_dump_templates)
        tpl->Dump(tpl->template_file());
    }

    // The rest of the loop creates the header file
    if (!FLAG_header)
      continue;            // They don't want header files

    tpl->WriteHeaderEntries(&((*it)->header_entries));
  }

  // We have headers to emit:
  // . If --outputfile was given, we combine all the header entries and
  //   write them to the given output file. If any template had errors,
  //   we fail and do not generate an output file.
  // . Otherwise, we write one output file per template we processed.
  // . In both cases, we add proper boilerplate first.
  if (FLAG_header) {
    string progname = argv[0];

    if (!FLAG_outputfile.empty()) {  // All header entries written to one file.
      // If any template had an error, we do not produce an output file.
      if (num_errors == 0) {
        vector<string> template_filenames;
        string all_header_entries;
        for (vector<TemplateRecord*>::const_iterator
             it = template_records.begin(); it != template_records.end(); ++it) {
          all_header_entries.append((*it)->header_entries);
          template_filenames.push_back((*it)->name);
        }
        string output = Boilerplate(progname, template_filenames);
        const string cleantext =
            TextWithDuplicateLinesRemoved(all_header_entries);
        output.append(WrapWithGuard(FLAG_outputfile, cleantext));
        if (!WriteToDisk(FLAG_log_info, FLAG_outputfile, output))
          num_errors++;
      }
    } else {
      // Each template will have its own output file. Skip any that had errors.
      for (vector<TemplateRecord*>::const_iterator
           it = template_records.begin(); it != template_records.end(); ++it) {
        if ((*it)->error)
          continue;
        string basename = GOOGLE_NAMESPACE::Basename((*it)->name);
        string output_file =
            GOOGLE_NAMESPACE::PathJoin(FLAG_header_dir,
                                basename + FLAG_outputfile_suffix);
        vector<string> template_filenames;   // Contains one template filename.
        template_filenames.push_back((*it)->name);
        string output = Boilerplate(progname, template_filenames);
        output.append(WrapWithGuard(output_file, (*it)->header_entries));
        if (!WriteToDisk(FLAG_log_info, output_file, output))
          num_errors++;
      }
    }
  }

  // Free dynamic memory
  for (vector<TemplateRecord*>::iterator it = template_records.begin();
       it != template_records.end(); ++it) {
    delete *it;
  }

  // Cap at 127 to avoid causing problems with return code
  return num_errors > 127 ? 127 : num_errors;
}